

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# likelihoodfunc.hpp
# Opt level: O0

void __thiscall ftree<double>::addroute(ftree<double> *this,Node *node,uint *edgeid)

{
  initializer_list<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  __l;
  initializer_list<unsigned_int> __l_00;
  iterator hubid;
  bool bVar1;
  bool bVar2;
  mapped_type *this_00;
  const_reference __x;
  size_type sVar3;
  pointer ppVar4;
  reference edgeid_00;
  _Self local_b0;
  _Self local_a8;
  _Self *local_a0;
  iterator *itfnode;
  value_type *edge;
  allocator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  local_79;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_78;
  iterator local_70;
  size_type local_68;
  vector<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
  local_60;
  _Rb_tree_color local_44;
  iterator local_40;
  size_type local_38;
  _Self local_30;
  _Self local_28;
  iterator it;
  uint *edgeid_local;
  Node *node_local;
  ftree<double> *this_local;
  
  it._M_node = (_Base_ptr)edgeid;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::pair<const___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
       ::find(&this->routes,node);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::pair<const___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
       ::end(&this->routes);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator->(&local_28);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&ppVar4->second,&(it._M_node)->_M_color);
  }
  else {
    local_44 = (it._M_node)->_M_color;
    local_40 = &local_44;
    local_38 = 1;
    this_00 = std::
              map<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::pair<const___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator[](&this->routes,node);
    __l_00._M_len = local_38;
    __l_00._M_array = local_40;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(this_00,__l_00);
  }
  hubid._M_node = it._M_node;
  local_78._M_current = node->_M_current;
  local_70 = &local_78;
  local_68 = 1;
  std::
  allocator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  ::allocator(&local_79);
  __l._M_len = local_68;
  __l._M_array = local_70;
  std::
  vector<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::vector(&local_60,__l,&local_79);
  addport(this,&(hubid._M_node)->_M_color,&local_60);
  std::
  vector<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::~vector(&local_60);
  std::
  allocator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  ::~allocator(&local_79);
  itfnode = (iterator *)
            std::
            vector<std::array<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_2UL>,_std::allocator<std::array<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_2UL>_>_>
            ::operator[](&this->edges,(ulong)(it._M_node)->_M_color);
  __x = std::
        array<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_2UL>
        ::operator[]((array<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_2UL>
                      *)itfnode,0);
  local_a8._M_node =
       (_Base_ptr)
       std::
       map<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::pair<const___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
       ::find(&this->routes,__x);
  local_a0 = &local_a8;
  local_b0._M_node =
       (_Base_ptr)
       std::
       map<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::pair<const___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
       ::end(&this->routes);
  bVar2 = std::operator!=(&local_a8,&local_b0);
  bVar1 = false;
  if (bVar2) {
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator->(local_a0);
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&ppVar4->second);
    bVar1 = sVar3 != 0;
  }
  if (bVar1) {
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator->(local_a0);
    edgeid_00 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&ppVar4->second,0);
    addroute(this,node,edgeid_00);
  }
  return;
}

Assistant:

inline void addroute(const Node& node, const uint& edgeid) {
      auto it = routes.find(node);
      if(it != routes.end()) {
	it->second.push_back(edgeid);
      } else {
        routes[node] = {edgeid};
      }
      addport(edgeid, {node});
      //also update this node's route to former edges
      const auto& edge = edges[edgeid];
      const auto& itfnode = routes.find(edge[0]);
      //if such former edge exist and the joint node is not the headnode
      if(itfnode != routes.end() && itfnode->second.size()) {
	//we assume that in the array of edges each node map to, the smaller
	//the corresponding index is, the closer such edge is to the node
	addroute(node, (itfnode->second)[0]);
      }
    }